

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImageView.cpp
# Opt level: O0

Ptr<ImageView>
myvk::ImageView::Create
          (Ptr<ImageBase> *image,VkImageViewType view_type,VkFormat format,
          VkImageAspectFlags aspect_mask,uint32_t base_mip_level,uint32_t level_count,
          uint32_t base_array_layer,uint32_t layer_count,VkComponentMapping *components)

{
  element_type *this;
  undefined4 in_ECX;
  undefined4 in_EDX;
  element_type *in_RDI;
  undefined4 in_R8D;
  undefined4 in_R9D;
  Ptr<ImageView> PVar1;
  VkImageViewCreateInfo create_info;
  undefined4 local_70 [6];
  VkImage local_58;
  undefined4 local_50;
  undefined4 local_4c;
  undefined8 local_48;
  undefined8 local_40;
  undefined4 local_38;
  undefined4 local_34;
  undefined4 local_20;
  undefined4 local_1c;
  undefined4 local_18;
  undefined4 local_14;
  
  local_20 = in_R9D;
  local_1c = in_R8D;
  local_18 = in_ECX;
  local_14 = in_EDX;
  memset(local_70,0,0x50);
  local_70[0] = 0xf;
  this = std::__shared_ptr_access<myvk::ImageBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
         operator->((__shared_ptr_access<myvk::ImageBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     *)0x2ce023);
  local_58 = ImageBase::GetHandle(this);
  local_50 = local_14;
  local_4c = local_18;
  local_38 = local_1c;
  local_34 = local_20;
  local_48 = *create_info.pNext;
  local_40 = *(undefined8 *)((long)create_info.pNext + 8);
  PVar1 = Create((Ptr<ImageBase> *)create_info._32_8_,(VkImageViewCreateInfo *)create_info.image);
  PVar1.super___shared_ptr<myvk::ImageView,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (Ptr<ImageView>)PVar1.super___shared_ptr<myvk::ImageView,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Ptr<ImageView> ImageView::Create(const Ptr<ImageBase> &image, VkImageViewType view_type, VkFormat format,
                                 VkImageAspectFlags aspect_mask, uint32_t base_mip_level, uint32_t level_count,
                                 uint32_t base_array_layer, uint32_t layer_count,
                                 const VkComponentMapping &components) {
	VkImageViewCreateInfo create_info = {};
	create_info.sType = VK_STRUCTURE_TYPE_IMAGE_VIEW_CREATE_INFO;
	create_info.image = image->GetHandle();
	create_info.viewType = view_type;
	create_info.format = format;
	create_info.subresourceRange.aspectMask = aspect_mask;
	create_info.subresourceRange.baseMipLevel = base_mip_level;
	create_info.subresourceRange.levelCount = level_count;
	create_info.subresourceRange.baseArrayLayer = base_array_layer;
	create_info.subresourceRange.layerCount = layer_count;
	create_info.components = components;

	return Create(image, create_info);
}